

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

int maxdirsterid<btVector3>(btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  int n;
  int iVar1;
  int iVar2;
  int *piVar3;
  btAlignedObjectArray<int> *in_RCX;
  btAlignedObjectArray<int> *in_RDX;
  btVector3 *in_RDI;
  int md;
  btScalar c_1;
  btScalar s_1;
  btScalar xx;
  int mc;
  int mb;
  btScalar c;
  btScalar s;
  btScalar x;
  int ma;
  btVector3 v;
  btVector3 u;
  int m;
  btVector3 *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  btAlignedObjectArray<int> *in_stack_fffffffffffffeb8;
  btVector3 *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  btAlignedObjectArray<int> *in_stack_fffffffffffffed0;
  btVector3 in_stack_ffffffffffffff18;
  float local_bc;
  int local_b8;
  float local_54;
  int local_50;
  
  do {
    n = maxdirfiltered<btVector3>
                  ((btVector3 *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                   in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    piVar3 = btAlignedObjectArray<int>::operator[](in_RCX,n);
    if (*piVar3 == 3) {
      return n;
    }
    orth(in_stack_ffffffffffffff18.m_floats._8_8_);
    btCross((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            in_stack_fffffffffffffea8);
    local_50 = -1;
    for (local_54 = 0.0; local_54 <= 360.0; local_54 = local_54 + 45.0) {
      in_stack_fffffffffffffecc = 0x3c8efa35;
      btSin(0.0);
      btCos(0.0);
      in_stack_fffffffffffffed0 = in_RDX;
      operator*(in_stack_fffffffffffffec0,(btScalar *)in_stack_fffffffffffffeb8);
      operator*(in_stack_fffffffffffffec0,(btScalar *)in_stack_fffffffffffffeb8);
      operator+(in_stack_fffffffffffffec0,(btVector3 *)in_stack_fffffffffffffeb8);
      operator*(in_stack_fffffffffffffec0,(btScalar *)in_stack_fffffffffffffeb8);
      operator+(in_stack_fffffffffffffec0,(btVector3 *)in_stack_fffffffffffffeb8);
      iVar1 = maxdirfiltered<btVector3>
                        ((btVector3 *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if ((local_50 == n) && (iVar1 == n)) {
        piVar3 = btAlignedObjectArray<int>::operator[](in_RCX,n);
        *piVar3 = 3;
        return n;
      }
      if ((local_50 != -1) && (local_50 != iVar1)) {
        local_b8 = local_50;
        for (local_bc = local_54 - 40.0; local_bc <= local_54; local_bc = local_bc + 5.0) {
          in_stack_fffffffffffffeb4 = 0x3c8efa35;
          btSin(0.0);
          btCos(0.0);
          in_stack_fffffffffffffeb8 = in_RDX;
          in_stack_fffffffffffffec0 = in_RDI;
          operator*(in_RDI,(btScalar *)in_RDX);
          operator*(in_stack_fffffffffffffec0,(btScalar *)in_stack_fffffffffffffeb8);
          operator+(in_stack_fffffffffffffec0,(btVector3 *)in_stack_fffffffffffffeb8);
          in_stack_ffffffffffffff18 =
               operator*(in_stack_fffffffffffffec0,(btScalar *)in_stack_fffffffffffffeb8);
          operator+(in_stack_fffffffffffffec0,(btVector3 *)in_stack_fffffffffffffeb8);
          iVar2 = maxdirfiltered<btVector3>
                            ((btVector3 *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          if ((local_b8 == n) && (iVar2 == n)) {
            piVar3 = btAlignedObjectArray<int>::operator[](in_RCX,n);
            *piVar3 = 3;
            return n;
          }
          local_b8 = iVar2;
        }
      }
      local_50 = iVar1;
    }
    piVar3 = btAlignedObjectArray<int>::operator[](in_RCX,n);
    *piVar3 = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = btCross(u,dir);
		int ma=-1;
		for(btScalar x = btScalar(0.0) ; x<= btScalar(360.0) ; x+= btScalar(45.0))
		{
			btScalar s = btSin(SIMD_RADS_PER_DEG*(x));
			btScalar c = btCos(SIMD_RADS_PER_DEG*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(btScalar xx = x-btScalar(40.0) ; xx <= x ; xx+= btScalar(5.0))
				{
					btScalar s = btSin(SIMD_RADS_PER_DEG*(xx));
					btScalar c = btCos(SIMD_RADS_PER_DEG*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	btAssert(0);
	return m;
}